

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

void __thiscall
testing::internal::
CartesianProductGenerator<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::EncodeParameters>
::IteratorImpl<testing::internal::IndexSequence<0UL,_1UL>_>::IteratorImpl
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL>_> *this,
          ParamGeneratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::EncodeParameters>_>
          *base,tuple<testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<(anonymous_namespace)::EncodeParameters>_>
                *generators,bool is_end)

{
  __uniq_ptr_impl<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
  _Var1;
  __uniq_ptr_impl<testing::internal::ParamIteratorInterface<(anonymous_namespace)::EncodeParameters>,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::EncodeParameters>_>_>
  _Var2;
  __uniq_ptr_impl<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
  _Var3;
  tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<(anonymous_namespace)::EncodeParameters>_>
  *ptVar4;
  ParamIterator<const_libaom_test::CodecFactory_*> local_40;
  ParamIterator<(anonymous_namespace)::EncodeParameters> local_38;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  (this->
  super_ParamIteratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::EncodeParameters>_>
  )._vptr_ParamIteratorInterface = (_func_int **)&PTR__IteratorImpl_01045430;
  this->base_ = base;
  _Var1._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
  .
  super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_false>
  ._M_head_impl._0_4_ =
       (*((generators->
          super__Tuple_impl<0UL,_testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<(anonymous_namespace)::EncodeParameters>_>
          ).
          super__Head_base<0UL,_testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_false>
          ._M_head_impl.impl_.
          super___shared_ptr<const_testing::internal::ParamGeneratorInterface<const_libaom_test::CodecFactory_*>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr)->_vptr_ParamGeneratorInterface[2])();
  _Var1._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
  .
  super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_false>
  ._M_head_impl._4_4_ = extraout_var;
  local_40.impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
  .
  super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_false>
  ._M_head_impl =
       (unique_ptr<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
        )(unique_ptr<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
          )_Var1._M_t.
           super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
           .
           super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_false>
           ._M_head_impl;
  _Var2._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::EncodeParameters>_*,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::EncodeParameters>_>_>
  .
  super__Head_base<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::EncodeParameters>_*,_false>
  ._M_head_impl =
       (tuple<testing::internal::ParamIteratorInterface<(anonymous_namespace)::EncodeParameters>_*,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::EncodeParameters>_>_>
        )(**(code **)(*(long *)(generators->
                               super__Tuple_impl<0UL,_testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<(anonymous_namespace)::EncodeParameters>_>
                               ).
                               super__Tuple_impl<1UL,_testing::internal::ParamGenerator<(anonymous_namespace)::EncodeParameters>_>
                               .
                               super__Head_base<1UL,_testing::internal::ParamGenerator<(anonymous_namespace)::EncodeParameters>,_false>
                               ._M_head_impl.impl_.
                               super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::EncodeParameters>,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr + 0x10))();
  local_38.impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<(anonymous_namespace)::EncodeParameters>,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::EncodeParameters>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::EncodeParameters>_*,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::EncodeParameters>_>_>
  .
  super__Head_base<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::EncodeParameters>_*,_false>
  ._M_head_impl =
       (unique_ptr<testing::internal::ParamIteratorInterface<(anonymous_namespace)::EncodeParameters>,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::EncodeParameters>_>_>
        )(unique_ptr<testing::internal::ParamIteratorInterface<(anonymous_namespace)::EncodeParameters>,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::EncodeParameters>_>_>
          )_Var2._M_t.
           super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::EncodeParameters>_*,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::EncodeParameters>_>_>
           .
           super__Head_base<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::EncodeParameters>_*,_false>
           ._M_head_impl;
  std::
  tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<(anonymous_namespace)::EncodeParameters>_>
  ::
  tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<(anonymous_namespace)::EncodeParameters>,_true>
            (&this->begin_,&local_40,&local_38);
  if ((__uniq_ptr_impl<testing::internal::ParamIteratorInterface<(anonymous_namespace)::EncodeParameters>,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::EncodeParameters>_>_>
       )_Var2._M_t.
        super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::EncodeParameters>_*,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::EncodeParameters>_>_>
        .
        super__Head_base<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::EncodeParameters>_*,_false>
        ._M_head_impl !=
      (__uniq_ptr_impl<testing::internal::ParamIteratorInterface<(anonymous_namespace)::EncodeParameters>,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::EncodeParameters>_>_>
       )0x0) {
    (**(code **)(*(long *)_Var2._M_t.
                          super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::EncodeParameters>_*,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::EncodeParameters>_>_>
                          .
                          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::EncodeParameters>_*,_false>
                          ._M_head_impl + 8))
              (_Var2._M_t.
               super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::EncodeParameters>_*,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::EncodeParameters>_>_>
               .
               super__Head_base<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::EncodeParameters>_*,_false>
               ._M_head_impl);
  }
  if ((__uniq_ptr_impl<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
       )_Var1._M_t.
        super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
        .
        super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_false>
        ._M_head_impl !=
      (__uniq_ptr_impl<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
       )0x0) {
    (**(code **)(*(long *)_Var1._M_t.
                          super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
                          .
                          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_false>
                          ._M_head_impl + 8))
              (_Var1._M_t.
               super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
               .
               super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_false>
               ._M_head_impl);
  }
  _Var3._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
  .
  super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_false>
  ._M_head_impl._0_4_ =
       (*((generators->
          super__Tuple_impl<0UL,_testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<(anonymous_namespace)::EncodeParameters>_>
          ).
          super__Head_base<0UL,_testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_false>
          ._M_head_impl.impl_.
          super___shared_ptr<const_testing::internal::ParamGeneratorInterface<const_libaom_test::CodecFactory_*>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr)->_vptr_ParamGeneratorInterface[3])();
  _Var3._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
  .
  super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_false>
  ._M_head_impl._4_4_ = extraout_var_00;
  local_40.impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
  .
  super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_false>
  ._M_head_impl =
       (unique_ptr<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
        )(unique_ptr<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
          )_Var3._M_t.
           super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
           .
           super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_false>
           ._M_head_impl;
  _Var2._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::EncodeParameters>_*,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::EncodeParameters>_>_>
  .
  super__Head_base<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::EncodeParameters>_*,_false>
  ._M_head_impl =
       (tuple<testing::internal::ParamIteratorInterface<(anonymous_namespace)::EncodeParameters>_*,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::EncodeParameters>_>_>
        )(**(code **)(*(long *)(generators->
                               super__Tuple_impl<0UL,_testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<(anonymous_namespace)::EncodeParameters>_>
                               ).
                               super__Tuple_impl<1UL,_testing::internal::ParamGenerator<(anonymous_namespace)::EncodeParameters>_>
                               .
                               super__Head_base<1UL,_testing::internal::ParamGenerator<(anonymous_namespace)::EncodeParameters>,_false>
                               ._M_head_impl.impl_.
                               super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::EncodeParameters>,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr + 0x18))();
  local_38.impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<(anonymous_namespace)::EncodeParameters>,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::EncodeParameters>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::EncodeParameters>_*,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::EncodeParameters>_>_>
  .
  super__Head_base<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::EncodeParameters>_*,_false>
  ._M_head_impl =
       (unique_ptr<testing::internal::ParamIteratorInterface<(anonymous_namespace)::EncodeParameters>,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::EncodeParameters>_>_>
        )(unique_ptr<testing::internal::ParamIteratorInterface<(anonymous_namespace)::EncodeParameters>,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::EncodeParameters>_>_>
          )_Var2._M_t.
           super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::EncodeParameters>_*,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::EncodeParameters>_>_>
           .
           super__Head_base<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::EncodeParameters>_*,_false>
           ._M_head_impl;
  std::
  tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<(anonymous_namespace)::EncodeParameters>_>
  ::
  tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<(anonymous_namespace)::EncodeParameters>,_true>
            (&this->end_,&local_40,&local_38);
  if ((__uniq_ptr_impl<testing::internal::ParamIteratorInterface<(anonymous_namespace)::EncodeParameters>,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::EncodeParameters>_>_>
       )_Var2._M_t.
        super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::EncodeParameters>_*,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::EncodeParameters>_>_>
        .
        super__Head_base<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::EncodeParameters>_*,_false>
        ._M_head_impl !=
      (__uniq_ptr_impl<testing::internal::ParamIteratorInterface<(anonymous_namespace)::EncodeParameters>,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::EncodeParameters>_>_>
       )0x0) {
    (**(code **)(*(long *)_Var2._M_t.
                          super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::EncodeParameters>_*,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::EncodeParameters>_>_>
                          .
                          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::EncodeParameters>_*,_false>
                          ._M_head_impl + 8))
              (_Var2._M_t.
               super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::EncodeParameters>_*,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::EncodeParameters>_>_>
               .
               super__Head_base<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::EncodeParameters>_*,_false>
               ._M_head_impl);
  }
  if ((__uniq_ptr_impl<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
       )_Var3._M_t.
        super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
        .
        super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_false>
        ._M_head_impl !=
      (__uniq_ptr_impl<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
       )0x0) {
    (**(code **)(*(long *)_Var3._M_t.
                          super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
                          .
                          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_false>
                          ._M_head_impl + 8))
              (_Var3._M_t.
               super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
               .
               super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_false>
               ._M_head_impl);
  }
  ptVar4 = &this->begin_;
  if (is_end) {
    ptVar4 = &this->end_;
  }
  std::
  tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<(anonymous_namespace)::EncodeParameters>_>
  ::tuple(&this->current_,ptVar4);
  (this->current_value_).
  super___shared_ptr<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::EncodeParameters>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->current_value_).
  super___shared_ptr<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::EncodeParameters>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ComputeCurrentValue(this);
  return;
}

Assistant:

IteratorImpl(const ParamGeneratorInterface<ParamType>* base,
                 const std::tuple<ParamGenerator<T>...>& generators,
                 bool is_end)
        : base_(base),
          begin_(std::get<I>(generators).begin()...),
          end_(std::get<I>(generators).end()...),
          current_(is_end ? end_ : begin_) {
      ComputeCurrentValue();
    }